

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# targets.c
# Opt level: O1

void make_constructors(GlobalVars *gv)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  node *__s2;
  node *pnVar4;
  uint8_t *puVar5;
  LinkFile *lf;
  ObjectUnit *ou;
  long lVar6;
  long lVar7;
  int iVar8;
  node *__s1;
  int cnt;
  node *pnVar9;
  long lVar10;
  size_t size;
  
  if (gv->dest_object != 0) {
    return;
  }
  if (gv->ctor_symbol == (Symbol *)0x0) {
    if (gv->dtor_symbol == (Symbol *)0x0) {
      return;
    }
  }
  else if ((gv->ctor_symbol->flags & 2) != 0) {
    pnVar4 = (gv->pripointers).first;
    if (pnVar4->next == (node *)0x0) {
      __s2 = (node *)0x0;
    }
    else {
      pnVar9 = (node *)0x0;
      do {
        iVar8 = strcmp((char *)pnVar4[1].pred,gv->ctor_symbol->name);
        __s2 = pnVar9;
        if (((iVar8 == 0) && (__s2 = pnVar4[1].next, pnVar9 != (node *)0x0)) &&
           (iVar8 = strcmp((char *)pnVar9,(char *)__s2), __s2 = pnVar9, iVar8 != 0)) {
          error(0x7d);
        }
        pnVar4 = pnVar4->next;
        pnVar9 = __s2;
      } while (pnVar4->next != (node *)0x0);
    }
    bVar2 = true;
    if (__s2 == (node *)0x0) {
      __s2 = (node *)xtors_secname(gv,".ctors");
    }
    goto LAB_00110ccd;
  }
  __s2 = (node *)0x0;
  bVar2 = false;
LAB_00110ccd:
  if ((gv->dtor_symbol == (Symbol *)0x0) || ((gv->dtor_symbol->flags & 2) == 0)) {
    pnVar4 = (node *)0x0;
    bVar1 = false;
  }
  else {
    pnVar9 = (gv->pripointers).first;
    if (pnVar9->next == (node *)0x0) {
      pnVar4 = (node *)0x0;
    }
    else {
      __s1 = (node *)0x0;
      do {
        iVar8 = strcmp((char *)pnVar9[1].pred,gv->dtor_symbol->name);
        pnVar4 = __s1;
        if (((iVar8 == 0) && (pnVar4 = pnVar9[1].next, __s1 != (node *)0x0)) &&
           (iVar8 = strcmp((char *)__s1,(char *)pnVar4), pnVar4 = __s1, iVar8 != 0)) {
          error(0x7d);
        }
        pnVar9 = pnVar9->next;
        __s1 = pnVar4;
      } while (pnVar9->next != (node *)0x0);
    }
    bVar1 = true;
    if (pnVar4 == (node *)0x0) {
      pnVar4 = (node *)xtors_secname(gv,".dtors");
    }
  }
  if (!(bool)(bVar2 | bVar1)) {
    return;
  }
  pnVar9 = (gv->pripointers).first;
  if (pnVar9->next == (node *)0x0) {
    iVar8 = 0;
    cnt = 0;
  }
  else {
    cnt = 0;
    iVar8 = 0;
    do {
      if (bVar2) {
        iVar3 = strcmp((char *)pnVar9[1].pred,gv->ctor_symbol->name);
        cnt = cnt + (uint)(iVar3 == 0);
      }
      if (bVar1) {
        iVar3 = strcmp((char *)pnVar9[1].pred,gv->dtor_symbol->name);
        iVar8 = iVar8 + (uint)(iVar3 == 0);
      }
      pnVar9 = pnVar9->next;
    } while (pnVar9->next != (node *)0x0);
  }
  lVar6 = (long)(cnt + 2);
  if (!bVar2) {
    lVar6 = 0;
  }
  lVar7 = (long)((char)(((byte)(fff[gv->dest_format]->addr_bits >> 7) >> 5) +
                       fff[gv->dest_format]->addr_bits) >> 3);
  lVar10 = (long)(iVar8 + 2);
  if (!bVar1) {
    lVar10 = 0;
  }
  size = (lVar10 + lVar6) * lVar7;
  puVar5 = (uint8_t *)alloczero(size);
  lf = (LinkFile *)alloczero(0x40);
  lf->objname = "INITEXIT";
  lf->filename = "INITEXIT";
  lf->pathname = "INITEXIT";
  lf->data = puVar5;
  lf->length = size;
  lf->format = gv->dest_format;
  lf->type = '\x03';
  ou = create_objunit(gv,lf,"INITEXIT");
  if (bVar2) {
    write_constructors(gv,ou,gv->ctor_symbol,cnt,0,(char *)__s2);
  }
  if (bVar1) {
    write_constructors(gv,ou,gv->dtor_symbol,iVar8,lVar6 * lVar7,(char *)pnVar4);
  }
  ou->lnkfile->type = '\x01';
  add_objunit(gv,ou,0);
  return;
}

Assistant:

void make_constructors(struct GlobalVars *gv)
/* Create an artificial object for constructor/destructor lists
   and fill them will entries from the PriPointer list. */
{
  if (!gv->dest_object && (gv->ctor_symbol || gv->dtor_symbol)) {
    int nctors=0,ndtors=0;
    bool ctors=FALSE,dtors=FALSE;
    const char *csecname=NULL,*dsecname=NULL;
    unsigned long clen,dlen;
    struct PriPointer *pp;
    uint8_t *data;
    struct ObjectUnit *ou;

    /* check if constructors or destructors are needed (referenced) */
    if (gv->ctor_symbol) {
      if (gv->ctor_symbol->flags & SYMF_REFERENCED) {
        ctors = TRUE;
        for (pp=(struct PriPointer *)gv->pripointers.first;
             pp->n.next!=NULL; pp=(struct PriPointer *)pp->n.next) {
          if (!strcmp(pp->listname,gv->ctor_symbol->name)) {
            if (csecname) {
              if (strcmp(csecname,pp->secname))
                error(125);  /* CTORS/DTORS spread over multiple sections */
            }
            else
              csecname = pp->secname;
          }
        }
        if (!csecname)
          csecname = xtors_secname(gv,ctors_name);
      }
    }
    if (gv->dtor_symbol) {
      if (gv->dtor_symbol->flags & SYMF_REFERENCED) {
        dtors = TRUE;
        for (pp=(struct PriPointer *)gv->pripointers.first;
             pp->n.next!=NULL; pp=(struct PriPointer *)pp->n.next) {
          if (!strcmp(pp->listname,gv->dtor_symbol->name)) {
            if (dsecname) {
              if (strcmp(dsecname,pp->secname))
                error(125);  /* CTORS/DTORS spread over multiple sections */
            }
            else
              dsecname = pp->secname;
          }
        }
        if (!dsecname)
          dsecname = xtors_secname(gv,dtors_name);
      }
    }
    if (!ctors && !dtors)
      return;

    /* count number of constructor and destructor pointers */
    for (pp=(struct PriPointer *)gv->pripointers.first;
         pp->n.next!=NULL; pp=(struct PriPointer *)pp->n.next) {
      if (ctors) {
        if (!strcmp(pp->listname,gv->ctor_symbol->name))
          nctors++;
      }
      if (dtors) {
        if (!strcmp(pp->listname,gv->dtor_symbol->name))
          ndtors++;
      }
    }

    /* create artificial object */
    clen = (unsigned long)(fff[gv->dest_format]->addr_bits / 8) *
            (ctors ? nctors+2 : 0);
    dlen = (unsigned long)(fff[gv->dest_format]->addr_bits / 8) *
            (dtors ? ndtors+2 : 0);
    data = alloczero(clen + dlen);
    ou = art_objunit(gv,"INITEXIT",data,clen+dlen);

    /* write constructors/destructors */
    if (ctors)
      write_constructors(gv,ou,gv->ctor_symbol,nctors,0,csecname);
    if (dtors)
      write_constructors(gv,ou,gv->dtor_symbol,ndtors,clen,dsecname);

    /* enqueue artificial object unit into linking process */
    ou->lnkfile->type = ID_OBJECT;
    add_objunit(gv,ou,FALSE);
  }
}